

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeSORegImmOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Val & 0xf]);
  switch(Val >> 5 & 3) {
  case 0:
    iVar2 = 2;
    break;
  case 1:
    iVar2 = 3;
    break;
  case 2:
    iVar2 = 1;
    break;
  case 3:
    iVar2 = 4;
    bVar1 = true;
    goto LAB_0014d9a5;
  }
  bVar1 = false;
LAB_0014d9a5:
  uVar4 = Val >> 7 & 0x1f;
  iVar3 = 5;
  if (!bVar1) {
    iVar3 = iVar2;
  }
  if (uVar4 != 0) {
    iVar3 = iVar2;
  }
  MCOperand_CreateImm0(Inst,(ulong)(iVar3 + uVar4 * 8));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeSORegImmOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc Shift;
	unsigned Op;
	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned imm = fieldFromInstruction_4(Val, 7, 5);

	// Register-immediate
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	Shift = ARM_AM_lsl;
	switch (type) {
		case 0:
			Shift = ARM_AM_lsl;
			break;
		case 1:
			Shift = ARM_AM_lsr;
			break;
		case 2:
			Shift = ARM_AM_asr;
			break;
		case 3:
			Shift = ARM_AM_ror;
			break;
	}

	if (Shift == ARM_AM_ror && imm == 0)
		Shift = ARM_AM_rrx;

	Op = Shift | (imm << 3);
	MCOperand_CreateImm0(Inst, Op);

	return S;
}